

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::InternalDeallocate<true>(RepeatedField<int> *this)

{
  int iVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar2;
  HeapRep *pHVar3;
  HeapRep *pHVar4;
  HeapRep *pHVar5;
  HeapRep *pHVar6;
  HeapRep *pHVar7;
  HeapRep *pHVar8;
  HeapRep *pHVar9;
  int *key;
  RepeatedField<int> *this_00;
  RepeatedField<long> *this_01;
  RepeatedField<unsigned_int> *this_02;
  RepeatedField<unsigned_long> *this_03;
  RepeatedField<float> *this_04;
  RepeatedField<double> *this_05;
  RepeatedField<bool> *this_06;
  RepeatedPtrFieldBase *this_07;
  iterator iVar10;
  undefined1 auStack_128 [8];
  undefined8 uStack_120;
  RepeatedField<bool> RStack_110;
  RepeatedField<double> RStack_e8;
  RepeatedField<float> RStack_c0;
  RepeatedField<unsigned_long> RStack_98;
  RepeatedField<unsigned_int> RStack_70;
  RepeatedField<long> RStack_48;
  RepeatedField<int> local_20;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
    paVar2 = &heap_rep(this)->field_0;
    if (paVar2->arena != (Arena *)0x0) {
      return;
    }
    pHVar3 = heap_rep(this);
    operator_delete(pHVar3,(long)iVar1 * 4 + 8);
    return;
  }
  this_00 = &local_20;
  InternalDeallocate<true>(this_00);
  if ((undefined1  [16])
      ((undefined1  [16])(((RepeatedField<long> *)this_00)->soo_rep_).field_0 &
      (undefined1  [16])0x4) != (undefined1  [16])0x0) {
    iVar1 = (((RepeatedField<long> *)this_00)->soo_rep_).field_0.long_rep.capacity;
    paVar2 = &RepeatedField<long>::heap_rep((RepeatedField<long> *)this_00)->field_0;
    if (paVar2->arena != (Arena *)0x0) {
      return;
    }
    pHVar4 = RepeatedField<long>::heap_rep((RepeatedField<long> *)this_00);
    operator_delete(pHVar4,(long)iVar1 * 8 + 8);
    return;
  }
  this_01 = &RStack_48;
  RepeatedField<long>::InternalDeallocate<true>(this_01);
  if ((undefined1  [16])
      ((undefined1  [16])(((RepeatedField<unsigned_int> *)this_01)->soo_rep_).field_0 &
      (undefined1  [16])0x4) != (undefined1  [16])0x0) {
    iVar1 = (((RepeatedField<unsigned_int> *)this_01)->soo_rep_).field_0.long_rep.capacity;
    paVar2 = &RepeatedField<unsigned_int>::heap_rep((RepeatedField<unsigned_int> *)this_01)->field_0
    ;
    if (paVar2->arena != (Arena *)0x0) {
      return;
    }
    pHVar5 = RepeatedField<unsigned_int>::heap_rep((RepeatedField<unsigned_int> *)this_01);
    operator_delete(pHVar5,(long)iVar1 * 4 + 8);
    return;
  }
  this_02 = &RStack_70;
  RepeatedField<unsigned_int>::InternalDeallocate<true>(this_02);
  if ((undefined1  [16])
      ((undefined1  [16])(((RepeatedField<unsigned_long> *)this_02)->soo_rep_).field_0 &
      (undefined1  [16])0x4) != (undefined1  [16])0x0) {
    iVar1 = (((RepeatedField<unsigned_long> *)this_02)->soo_rep_).field_0.long_rep.capacity;
    paVar2 = &RepeatedField<unsigned_long>::heap_rep((RepeatedField<unsigned_long> *)this_02)->
              field_0;
    if (paVar2->arena != (Arena *)0x0) {
      return;
    }
    pHVar6 = RepeatedField<unsigned_long>::heap_rep((RepeatedField<unsigned_long> *)this_02);
    operator_delete(pHVar6,(long)iVar1 * 8 + 8);
    return;
  }
  this_03 = &RStack_98;
  RepeatedField<unsigned_long>::InternalDeallocate<true>(this_03);
  if ((undefined1  [16])
      ((undefined1  [16])(((RepeatedField<float> *)this_03)->soo_rep_).field_0 &
      (undefined1  [16])0x4) != (undefined1  [16])0x0) {
    iVar1 = (((RepeatedField<float> *)this_03)->soo_rep_).field_0.long_rep.capacity;
    paVar2 = &RepeatedField<float>::heap_rep((RepeatedField<float> *)this_03)->field_0;
    if (paVar2->arena != (Arena *)0x0) {
      return;
    }
    pHVar7 = RepeatedField<float>::heap_rep((RepeatedField<float> *)this_03);
    operator_delete(pHVar7,(long)iVar1 * 4 + 8);
    return;
  }
  this_04 = &RStack_c0;
  RepeatedField<float>::InternalDeallocate<true>(this_04);
  if ((undefined1  [16])
      ((undefined1  [16])(((RepeatedField<double> *)this_04)->soo_rep_).field_0 &
      (undefined1  [16])0x4) != (undefined1  [16])0x0) {
    iVar1 = (((RepeatedField<double> *)this_04)->soo_rep_).field_0.long_rep.capacity;
    paVar2 = &RepeatedField<double>::heap_rep((RepeatedField<double> *)this_04)->field_0;
    if (paVar2->arena != (Arena *)0x0) {
      return;
    }
    pHVar8 = RepeatedField<double>::heap_rep((RepeatedField<double> *)this_04);
    operator_delete(pHVar8,(long)iVar1 * 8 + 8);
    return;
  }
  this_05 = &RStack_e8;
  RepeatedField<double>::InternalDeallocate<true>(this_05);
  if ((undefined1  [16])
      ((undefined1  [16])(((RepeatedField<bool> *)this_05)->soo_rep_).field_0 &
      (undefined1  [16])0x4) == (undefined1  [16])0x0) {
    this_06 = &RStack_110;
    uStack_120 = internal::RepeatedPtrFieldBase::
                 Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>;
    RepeatedField<bool>::InternalDeallocate<true>(this_06);
    key = (int *)(this_06->soo_rep_).field_0.long_rep.elements_int;
    if (key != (int *)0x0) {
      internal::RepeatedPtrFieldBase::
      Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
      return;
    }
    this_07 = (RepeatedPtrFieldBase *)auStack_128;
    internal::RepeatedPtrFieldBase::
    Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(this_07);
    iVar10 = absl::lts_20240722::container_internal::
             btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             ::internal_find<int>
                       ((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                         *)this_07,key);
    if (iVar10.node_ ==
        (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
         *)0x0) {
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             *)this_07);
    }
    return;
  }
  iVar1 = (((RepeatedField<bool> *)this_05)->soo_rep_).field_0.long_rep.capacity;
  uStack_120._0_4_ = 0x147a54;
  uStack_120._4_4_ = 0;
  paVar2 = &RepeatedField<bool>::heap_rep((RepeatedField<bool> *)this_05)->field_0;
  if (paVar2->arena != (Arena *)0x0) {
    return;
  }
  uStack_120._0_4_ = 0x147a6e;
  uStack_120._4_4_ = 0;
  pHVar9 = RepeatedField<bool>::heap_rep((RepeatedField<bool> *)this_05);
  operator_delete(pHVar9,(long)iVar1 + 8);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }